

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2loop.cc
# Opt level: O1

bool __thiscall S2Loop::IsValid(S2Loop *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  bool bVar3;
  S2Error error;
  S2LogMessage SStack_78;
  char *local_68;
  long local_60;
  char local_58 [16];
  S2Error local_48;
  
  paVar1 = &local_48.text_.field_2;
  local_48.code_ = OK;
  local_48.text_._M_string_length = 0;
  local_48.text_.field_2._M_local_buf[0] = '\0';
  local_48.text_._M_dataplus._M_p = (pointer)paVar1;
  bVar2 = FindValidationErrorNoIndex(this,&local_48);
  bVar3 = true;
  if (!bVar2) {
    bVar3 = s2shapeutil::FindSelfIntersection(&(this->index_).super_S2ShapeIndex,&local_48);
  }
  if ((bVar3 != false) && (FLAGS_s2debug == true)) {
    S2LogMessage::S2LogMessage
              (&SStack_78,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2loop.cc"
               ,0x83,kError,(ostream *)&std::cerr);
    local_68 = local_58;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_68,local_48.text_._M_dataplus._M_p,
               local_48.text_._M_dataplus._M_p + local_48.text_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(SStack_78.stream_,local_68,local_60);
    if (local_68 != local_58) {
      operator_delete(local_68);
    }
    S2LogMessage::~S2LogMessage(&SStack_78);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48.text_._M_dataplus._M_p != paVar1) {
    operator_delete(local_48.text_._M_dataplus._M_p);
  }
  return (bool)(bVar3 ^ 1);
}

Assistant:

bool S2Loop::IsValid() const {
  S2Error error;
  if (FindValidationError(&error)) {
    S2_LOG_IF(ERROR, FLAGS_s2debug) << error;
    return false;
  }
  return true;
}